

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_MissingKeyWithPresentPrefix_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_MissingKeyWithPresentPrefix_Test
          (ARTCorrectnessTest_MissingKeyWithPresentPrefix_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTCorrectnessTest_MissingKeyWithPresentPrefix_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTCorrectnessTest_MissingKeyWithPresentPrefix_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, MissingKeyWithPresentPrefix) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert(0x010000, unodb::test::test_values[0]);
  verifier.insert(0x000001, unodb::test::test_values[1]);
  verifier.insert(0x010001, unodb::test::test_values[2]);

  unodb::test::must_not_allocate([&verifier] {
    verifier.attempt_remove_missing_keys({0x000002, 0x010100, 0x010002});
  });
}